

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.c
# Opt level: O2

lws_mqtt_str_t * lws_mqtt_str_create_cstr_dup(char *buf,uint16_t lim)

{
  size_t sVar1;
  lws_mqtt_str_t *plVar2;
  int iVar3;
  undefined6 in_register_00000032;
  
  iVar3 = (int)CONCAT62(in_register_00000032,lim);
  sVar1 = strlen(buf);
  if (iVar3 == 0) {
    iVar3 = (int)sVar1;
  }
  plVar2 = lws_mqtt_str_create_init((uint8_t *)buf,(uint16_t)sVar1,(uint16_t)iVar3);
  return plVar2;
}

Assistant:

lws_mqtt_str_t *
lws_mqtt_str_create_cstr_dup(const char *buf, uint16_t lim)
{
	int len = strlen(buf);

	if (!lim)
		lim = len;

	return lws_mqtt_str_create_init((uint8_t *)buf, len, lim);
}